

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strripos(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  bool bVar2;
  sxi32 sVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  sxu32 nLen_00;
  char *pText;
  long lVar8;
  jx9_real jVar9;
  int nLen;
  sxu32 nOfft;
  int nPatLen;
  int local_4c;
  jx9_context *local_48;
  sxu32 local_40;
  sxu32 local_3c;
  char *local_38;
  
  uVar5 = 8;
  if (nArg < 2) {
    jVar9 = 0.0;
    goto LAB_00132056;
  }
  local_48 = pCtx;
  pcVar4 = jx9_value_to_string(*apArg,&local_4c);
  local_38 = jx9_value_to_string(apArg[1],(int *)&local_3c);
  iVar7 = (int)pcVar4 + local_4c;
  pText = pcVar4 + (long)local_4c + -1;
  local_40 = 0;
  pcVar6 = pcVar4;
  if (nArg != 2) {
    pjVar1 = apArg[2];
    jx9MemObjToInteger(pjVar1);
    uVar5 = (uint)(pjVar1->x).iVal;
    if ((int)uVar5 < 0) {
      if (local_4c == -uVar5 || SBORROW4(local_4c,-uVar5) != (int)(local_4c + uVar5) < 0)
      goto LAB_00131fbb;
      local_4c = local_4c + uVar5;
      iVar7 = (int)pcVar4 + local_4c;
      pText = pcVar4 + (long)local_4c + -1;
      bVar2 = true;
    }
    else if (local_4c - uVar5 == 0 || local_4c < (int)uVar5) {
LAB_00131fbb:
      pjVar1 = local_48->pRet;
      jx9MemObjRelease(pjVar1);
      (pjVar1->x).rVal = 0.0;
      pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 8;
      bVar2 = false;
    }
    else {
      bVar2 = true;
      pcVar6 = pcVar4 + (uVar5 & 0x7fffffff);
      local_4c = local_4c - uVar5;
    }
    if (!bVar2) {
      return 0;
    }
  }
  if (((0 < local_4c) && (0 < (int)local_3c)) && (pcVar6 < pText)) {
    lVar8 = (long)pcVar4 - (long)pText;
    nLen_00 = iVar7 - (int)pText;
    do {
      sVar3 = iPatternMatch(pText,nLen_00,local_38,local_3c,&local_40);
      if (sVar3 == 0) {
        jVar9 = (jx9_real)((ulong)local_40 - lVar8);
        uVar5 = 2;
        pCtx = local_48;
        goto LAB_00132056;
      }
      pText = pText + -1;
      lVar8 = lVar8 + 1;
      nLen_00 = nLen_00 + 1;
    } while (pcVar6 < pText);
  }
  jVar9 = 0.0;
  uVar5 = 8;
  pCtx = local_48;
LAB_00132056:
  pjVar1 = pCtx->pRet;
  jx9MemObjRelease(pjVar1);
  (pjVar1->x).rVal = jVar9;
  pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | uVar5;
  return 0;
}

Assistant:

static int jx9Builtin_strripos(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zStart, *zBlob, *zPattern, *zPtr, *zEnd;
	ProcStringMatch xPatternMatch = iPatternMatch; /* Case-insensitive pattern match */
	int nLen, nPatLen;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	/* Point to the end of the pattern */
	zPtr = &zBlob[nLen - 1];
	zEnd = &zBlob[nLen];
	/* Save the starting posistion */
	zStart = zBlob;
	nOfft = 0; /* cc warning */
	/* Peek the starting offset if available */
	if( nArg > 2 ){
		int nStart;
		nStart = jx9_value_to_int(apArg[2]);
		if( nStart < 0 ){
			nStart = -nStart;
			if( nStart >= nLen ){
				/* Invalid offset */
				jx9_result_bool(pCtx, 0);
				return JX9_OK;
			}else{
				nLen -= nStart;
				zPtr = &zBlob[nLen - 1];
				zEnd = &zBlob[nLen];
			}
		}else{
			if( nStart >= nLen ){
				/* Invalid offset */
				jx9_result_bool(pCtx, 0);
				return JX9_OK;
			}else{
				zBlob += nStart;
				nLen -= nStart;
			}
		}
	}
	if( nLen > 0 && nPatLen > 0 ){
		/* Perform the lookup */
		for(;;){
			if( zBlob >= zPtr ){
				break;
			}
			rc = xPatternMatch((const void *)zPtr, (sxu32)(zEnd-zPtr), (const void *)zPattern, (sxu32)nPatLen, &nOfft);
			if( rc == SXRET_OK ){
				/* Pattern found, return it's position */
				jx9_result_int64(pCtx, (jx9_int64)(&zPtr[nOfft] - zStart));
				return JX9_OK;
			}
			zPtr--;
		}
		/* Pattern not found, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}